

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O0

Hash Fossilize::Hashing::compute_hash_application_info(VkApplicationInfo *info)

{
  Hash HVar1;
  Hasher local_18;
  Hasher h;
  VkApplicationInfo *info_local;
  
  h.h = (Hash)info;
  Hasher::Hasher(&local_18);
  Hasher::u32(&local_18,*(uint32_t *)(h.h + 0x18));
  Hasher::u32(&local_18,*(uint32_t *)(h.h + 0x2c));
  Hasher::u32(&local_18,*(uint32_t *)(h.h + 0x28));
  if (*(long *)(h.h + 0x10) == 0) {
    Hasher::u32(&local_18,0);
  }
  else {
    Hasher::string(&local_18,*(char **)(h.h + 0x10));
  }
  if (*(long *)(h.h + 0x20) == 0) {
    Hasher::u32(&local_18,0);
  }
  else {
    Hasher::string(&local_18,*(char **)(h.h + 0x20));
  }
  HVar1 = Hasher::get(&local_18);
  return HVar1;
}

Assistant:

static Hash compute_hash_application_info(const VkApplicationInfo &info)
{
	Hasher h;
	h.u32(info.applicationVersion);
	h.u32(info.apiVersion);
	h.u32(info.engineVersion);

	if (info.pApplicationName)
		h.string(info.pApplicationName);
	else
		h.u32(0);

	if (info.pEngineName)
		h.string(info.pEngineName);
	else
		h.u32(0);

	return h.get();
}